

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

DisableIffAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::DisableIffAssertionExpr,slang::ast::Expression_const&,slang::ast::AssertionExpr_const&>
          (BumpAllocator *this,Expression *args,AssertionExpr *args_1)

{
  DisableIffAssertionExpr *pDVar1;
  
  pDVar1 = (DisableIffAssertionExpr *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DisableIffAssertionExpr *)this->endPtr < pDVar1 + 1) {
    pDVar1 = (DisableIffAssertionExpr *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pDVar1 + 1);
  }
  (pDVar1->super_AssertionExpr).kind = DisableIff;
  (pDVar1->super_AssertionExpr).syntax = (SyntaxNode *)0x0;
  pDVar1->condition = args;
  pDVar1->expr = args_1;
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }